

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_include_free_(lysf_ctx *ctx,lysp_include *include,ly_bool main_module)

{
  lysp_ext_instance *plVar1;
  undefined3 in_register_00000011;
  lysp_ext_instance *plVar2;
  long lVar3;
  
  if ((CONCAT31(in_register_00000011,main_module) != 0) &&
     (include->submodule != (lysp_submodule *)0x0)) {
    lysp_module_free(ctx,(lysp_module *)include->submodule);
  }
  lydict_remove(ctx->ctx,include->name);
  lydict_remove(ctx->ctx,include->dsc);
  lydict_remove(ctx->ctx,include->ref);
  lVar3 = 0;
  plVar2 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar1 = include->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
      return;
    }
    if (plVar1[-1].exts <= plVar2) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar1->name + lVar3));
    plVar2 = (lysp_ext_instance *)((long)&plVar2->name + 1);
    lVar3 = lVar3 + 0x70;
  }
  free(&plVar1[-1].exts);
  return;
}

Assistant:

static void
lysp_include_free_(struct lysf_ctx *ctx, struct lysp_include *include, ly_bool main_module)
{
    if (main_module && include->submodule) {
        lysp_module_free(ctx, (struct lysp_module *)include->submodule);
    }
    lydict_remove(ctx->ctx, include->name);
    lydict_remove(ctx->ctx, include->dsc);
    lydict_remove(ctx->ctx, include->ref);
    FREE_ARRAY(ctx, include->exts, lysp_ext_instance_free);
}